

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O2

int stbtt__run_charstring(stbtt_fontinfo *info,int glyph_index,stbtt__csctx *c)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  stbtt_uint32 sVar4;
  int iVar5;
  stbtt_uint32 sVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float dx2;
  float dy3;
  float fVar19;
  float fVar20;
  stbtt__buf fontdict;
  stbtt__buf sVar21;
  stbtt__buf local_258;
  float local_240;
  int local_23c;
  stbtt__buf local_238;
  ulong local_228;
  ulong local_220;
  undefined1 local_218 [8];
  undefined4 uStack_210;
  undefined4 uStack_20c;
  float local_208;
  uint uStack_204;
  uint uStack_200;
  uint uStack_1fc;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float afStack_1d8 [2];
  stbtt_fontinfo *local_1d0;
  float s [48];
  stbtt__buf local_108;
  float local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  stbtt__buf *local_e8;
  int *local_e0;
  stbtt__buf subr_stack [10];
  
  local_108 = info->subrs;
  local_238 = stbtt__cff_index_get(info->charstrings,glyph_index);
  uVar13 = local_238._8_8_;
  local_e8 = &info->fdselect;
  local_1d0 = info;
  local_e0 = &(info->gsubrs).cursor;
  uVar9 = uVar13 >> 0x20;
  bVar2 = false;
  uVar16 = 0;
  local_228 = 0;
  local_220 = 0;
  bVar3 = true;
LAB_0013cb4b:
  iVar15 = (int)uVar13;
  iVar14 = (int)uVar9;
  if (iVar14 <= iVar15) {
LAB_0013d688:
    return 0;
  }
  lVar7 = (long)iVar15 + 1;
  iVar5 = (int)lVar7;
  local_238.cursor = iVar5;
  bVar1 = local_238.data[iVar15];
  uVar12 = (uint)uVar16;
  switch(bVar1) {
  case 1:
  case 3:
  case 0x12:
  case 0x17:
    local_220 = (ulong)(uint)((int)local_220 + (int)uVar12 / 2);
    break;
  case 2:
  case 9:
  case 0xd:
  case 0xf:
  case 0x10:
  case 0x11:
switchD_0013cb8a_caseD_2:
    if (bVar1 < 0x20) {
      return 0;
    }
    if (bVar1 == 0xff) goto LAB_0013cc7d;
  case 0x1c:
    if (-1 < iVar15) {
      iVar14 = iVar15;
    }
    local_238.cursor = iVar14;
    sVar4 = stbtt__cff_int(&local_238);
    fVar17 = (float)(int)(short)sVar4;
LAB_0013cc96:
    if (0x2f < (int)uVar12) {
      return 0;
    }
    uVar16 = (ulong)(uVar12 + 1);
    s[(int)uVar12] = fVar17;
    goto LAB_0013d07b;
  case 4:
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar18 = s[uVar12 - 1];
    fVar17 = 0.0;
    goto LAB_0013cfaf;
  case 5:
    if ((int)uVar12 < 2) {
      return 0;
    }
    for (uVar9 = 1; uVar9 < uVar16; uVar9 = uVar9 + 2) {
      stbtt__csctx_rline_to(c,s[uVar9 - 1],s[uVar9]);
    }
    break;
  case 6:
    iVar14 = 0;
    if ((int)uVar12 < 1) {
      return 0;
    }
    for (; iVar14 < (int)uVar12; iVar14 = iVar14 + 1) {
      stbtt__csctx_rline_to(c,s[iVar14],0.0);
      iVar14 = iVar14 + 1;
LAB_0013d660:
      if ((int)uVar12 <= iVar14) break;
      stbtt__csctx_rline_to(c,0.0,s[iVar14]);
    }
    break;
  case 7:
    iVar14 = 0;
    if (0 < (int)uVar12) goto LAB_0013d660;
    return 0;
  case 8:
    if ((int)uVar12 < 6) {
      return 0;
    }
    for (uVar9 = 5; uVar9 < uVar16; uVar9 = uVar9 + 6) {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar9 - 1],afStack_1d8[uVar9],afStack_1d8[uVar9 + 1],s[uVar9 - 2],
                 s[uVar9 - 1],s[uVar9]);
    }
    break;
  case 10:
    if (bVar2) {
      bVar2 = true;
    }
    else {
      bVar2 = true;
      if ((local_1d0->fdselect).size != 0) {
        local_258.data = local_e8->data;
        lVar7._0_4_ = local_e8->cursor;
        lVar7._4_4_ = local_e8->size;
        uVar9 = 0;
        if (lVar7 < 0) {
          uVar9 = (ulong)(uint)lVar7._4_4_;
        }
        iVar14 = (int)uVar9;
        local_258.cursor = (undefined4)lVar7;
        local_258.size = lVar7._4_4_;
        local_23c = glyph_index;
        if ((int)lVar7._4_4_ < 1) {
LAB_0013d0f0:
          uVar8 = iVar14 + glyph_index;
          uVar11 = uVar8;
          if ((int)lVar7._4_4_ < (int)uVar8) {
            uVar11 = lVar7._4_4_;
          }
          if ((int)uVar8 < 0) {
            uVar11 = lVar7._4_4_;
          }
          uVar8 = 0;
          if ((int)uVar11 < (int)lVar7._4_4_) {
            uVar8 = (uint)local_258.data[(int)uVar11];
          }
        }
        else {
          local_258.cursor = 1;
          if (local_258.data[uVar9] == '\x03') {
            sVar6 = stbtt__buf_get(&local_258,2);
            sVar4 = stbtt__buf_get(&local_258,2);
            if ((int)sVar6 < 1) {
              sVar6 = 0;
            }
            iVar14 = sVar6 + 1;
            do {
              iVar14 = iVar14 + -1;
              if (iVar14 == 0) {
                uVar8 = 0xffffffff;
                break;
              }
              lVar7 = (long)local_258.cursor;
              uVar8 = 0;
              if (local_258.cursor < local_258.size) {
                local_258.cursor = local_258.cursor + 1;
                uVar8 = (uint)local_258.data[lVar7];
              }
              sVar6 = stbtt__buf_get(&local_258,2);
              bVar2 = local_23c < (int)sVar4;
              sVar4 = sVar6;
            } while ((int)sVar6 <= local_23c || bVar2);
          }
          else {
            iVar14 = 1;
            uVar8 = 0xffffffff;
            if (local_258.data[uVar9] == '\0') goto LAB_0013d0f0;
          }
        }
        sVar21 = local_1d0->cff;
        fontdict = stbtt__cff_index_get(local_1d0->fontdicts,uVar8);
        local_108 = stbtt__get_subrs(sVar21,fontdict);
        bVar2 = true;
        glyph_index = local_23c;
      }
    }
  case 0x1d:
    sVar21 = local_238;
    if ((int)uVar12 < 1) {
      return 0;
    }
    iVar14 = (int)local_228;
    if (9 < iVar14) {
      return 0;
    }
    uVar16 = (ulong)(uVar12 - 1);
    fVar17 = s[uVar16];
    subr_stack[iVar14].data = local_238.data;
    subr_stack[iVar14].cursor = local_238.cursor;
    subr_stack[iVar14].size = local_238.size;
    local_258.data = local_108.data;
    piVar10 = &local_108.cursor;
    if (bVar1 != 10) {
      local_258.data = (local_1d0->gsubrs).data;
      piVar10 = local_e0;
    }
    local_258.size = (int)((ulong)*(undefined8 *)piVar10 >> 0x20);
    local_258.cursor = local_258.size >> 0x1f & local_258.size;
    local_238 = sVar21;
    sVar4 = stbtt__buf_get(&local_258,2);
    uVar12 = (uint)(0x4d7 < (int)sVar4) << 10 | 0x6b;
    if (0x846b < (int)sVar4) {
      uVar12 = 0x8000;
    }
    iVar14 = uVar12 + (int)fVar17;
    sVar21 = (stbtt__buf)ZEXT816(0);
    if (iVar14 < (int)sVar4 && -1 < iVar14) {
      sVar21.cursor = local_258.cursor;
      sVar21.data = local_258.data;
      sVar21.size = local_258.size;
      sVar21 = stbtt__cff_index_get(sVar21,iVar14);
    }
    if (sVar21._8_8_ >> 0x20 == 0) {
      return 0;
    }
    local_228 = (ulong)((int)local_228 + 1);
    local_238.size = sVar21.size;
    local_238.data = sVar21.data;
    local_238.cursor = 0;
    goto LAB_0013d07b;
  case 0xb:
    if ((int)local_228 < 1) {
      return 0;
    }
    local_228 = (ulong)((int)local_228 - 1);
    local_238.data._4_4_ = *(undefined4 *)((long)&subr_stack[local_228].data + 4);
    local_238.data._0_4_ = *(undefined4 *)&subr_stack[local_228].data;
    local_238.cursor = subr_stack[local_228].cursor;
    local_238.size = subr_stack[local_228].size;
    goto LAB_0013d07b;
  case 0xc:
    if (iVar14 <= iVar5) {
      return 0;
    }
    local_238.cursor = iVar15 + 2;
    switch(local_238.data[lVar7]) {
    case '\"':
      if ((int)uVar12 < 7) {
        return 0;
      }
      _local_218 = ZEXT416((uint)s[2]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[4]);
      local_208 = s[5];
      local_1e8 = CONCAT44(local_1e8._4_4_,s[6]);
      stbtt__csctx_rccurve_to(c,s[0],0.0,s[1],s[2],s[3],0.0);
      fVar20 = -(float)local_218._0_4_;
      fVar19 = 0.0;
      dy3 = 0.0;
      fVar17 = (float)local_1e8;
      fVar18 = (float)local_1f8;
      dx2 = local_208;
      break;
    case '#':
      if ((int)uVar12 < 0xd) {
        return 0;
      }
      local_1e8 = CONCAT44(local_1e8._4_4_,s[6]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[7]);
      local_208 = s[8];
      local_218._0_4_ = s[9];
      local_f8 = s[10];
      local_240 = s[0xb];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar18 = (float)local_1e8;
      fVar19 = (float)local_1f8;
      fVar20 = (float)local_218._0_4_;
      dy3 = local_240;
      dx2 = local_208;
      fVar17 = local_f8;
      break;
    case '$':
      if ((int)uVar12 < 9) {
        return 0;
      }
      local_f8 = s[1];
      uStack_f4 = 0;
      uStack_f0 = 0;
      uStack_ec = 0;
      local_240 = s[3];
      local_1e8 = CONCAT44(local_1e8._4_4_,s[5]);
      local_1f8 = CONCAT44(local_1f8._4_4_,s[6]);
      local_218._0_4_ = s[7];
      local_208 = s[8];
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],0.0);
      dy3 = -(local_f8 + local_240 + (float)local_218._0_4_);
      fVar19 = 0.0;
      fVar18 = (float)local_1e8;
      fVar20 = (float)local_218._0_4_;
      dx2 = (float)local_1f8;
      fVar17 = local_208;
      break;
    case '%':
      if ((int)uVar12 < 0xb) {
        return 0;
      }
      local_1f8 = CONCAT44(s[7],s[6]);
      local_1e8 = CONCAT44(s[9],s[8]);
      uStack_1f0 = 0;
      uStack_1e0 = 0;
      fVar17 = s[0] + s[2] + s[4] + s[6] + s[8];
      fVar18 = s[1] + s[3] + s[5] + s[7] + s[9];
      fVar19 = ABS(fVar17);
      fVar20 = ABS(fVar18);
      local_218._4_4_ = 0.0;
      uStack_210 = 0;
      uStack_20c = 0;
      local_218._0_4_ = s[10];
      if (fVar19 <= fVar20) {
        uStack_210 = 0x80000000;
        uStack_20c = 0x80000000;
        local_218._0_4_ = -fVar17;
        local_218._4_4_ = -fVar18;
      }
      uVar12 = -(uint)(fVar20 < fVar19);
      uStack_204 = (uint)-fVar18 & (uint)fVar20;
      uStack_200 = (uint)-fVar18 & (uint)fVar20;
      uStack_1fc = (uint)-fVar18 & (uint)fVar20;
      local_208 = (float)(~uVar12 & (uint)s[10] | (uint)-fVar18 & uVar12);
      stbtt__csctx_rccurve_to(c,s[0],s[1],s[2],s[3],s[4],s[5]);
      fVar18 = (float)local_1f8;
      fVar19 = local_1f8._4_4_;
      fVar20 = local_1e8._4_4_;
      dy3 = local_208;
      dx2 = (float)local_1e8;
      fVar17 = (float)local_218._0_4_;
      break;
    default:
      goto LAB_0013d688;
    }
    goto LAB_0013d019;
  case 0xe:
    stbtt__csctx_close_shape(c);
    return 1;
  case 0x13:
  case 0x14:
    if (bVar3) {
      local_220 = (ulong)(uint)((int)local_220 + (int)uVar12 / 2);
    }
    iVar5 = ((int)local_220 + 7) / 8 + iVar5;
    local_238.cursor = iVar5;
    if (iVar14 < iVar5) {
      local_238.cursor = iVar14;
    }
    if (iVar5 < 0) {
      local_238.cursor = iVar14;
    }
    goto LAB_0013d070;
  case 0x15:
    if ((int)uVar12 < 2) {
      return 0;
    }
    fVar17 = s[uVar12 - 2];
    fVar18 = s[uVar12 - 1];
    goto LAB_0013cfaf;
  case 0x16:
    if ((int)uVar12 < 1) {
      return 0;
    }
    fVar17 = s[uVar12 - 1];
    fVar18 = 0.0;
LAB_0013cfaf:
    stbtt__csctx_rmove_to(c,fVar17,fVar18);
LAB_0013d070:
    bVar3 = false;
    break;
  case 0x18:
    if ((int)uVar12 < 8) {
      return 0;
    }
    for (uVar9 = 5; uVar9 < uVar12 - 2; uVar9 = uVar9 + 6) {
      stbtt__csctx_rccurve_to
                (c,afStack_1d8[uVar9 - 1],afStack_1d8[uVar9],afStack_1d8[uVar9 + 1],s[uVar9 - 2],
                 s[uVar9 - 1],s[uVar9]);
    }
    if ((int)uVar12 <= (int)uVar9 + -4) {
      return 0;
    }
    stbtt__csctx_rline_to(c,afStack_1d8[uVar9 - 1],afStack_1d8[uVar9]);
    break;
  case 0x19:
    if ((int)uVar12 < 8) {
      return 0;
    }
    for (uVar9 = 2; uVar9 - 1 < (ulong)(uVar12 - 6); uVar9 = uVar9 + 2) {
      stbtt__csctx_rline_to(c,s[uVar9 - 2],s[uVar9 - 1]);
    }
    if ((int)uVar12 <= (int)(uVar9 + 3)) {
      return 0;
    }
    fVar18 = s[uVar9 - 2];
    fVar19 = s[uVar9 - 1];
    fVar20 = s[(int)uVar9 + 1];
    dy3 = s[uVar9 + 3 & 0xffffffff];
    dx2 = s[uVar9 & 0xffffffff];
    fVar17 = s[(int)uVar9 + 2];
LAB_0013d019:
    stbtt__csctx_rccurve_to(c,fVar18,fVar19,dx2,fVar20,fVar17,dy3);
    break;
  case 0x1a:
  case 0x1b:
    if ((int)uVar12 < 4) {
      return 0;
    }
    fVar17 = 0.0;
    if ((uVar16 & 1) != 0) {
      fVar17 = s[0];
    }
    for (uVar9 = (ulong)(uVar12 & 1) + 3; uVar9 < uVar16; uVar9 = uVar9 + 4) {
      fVar18 = afStack_1d8[uVar9 + 1];
      if (bVar1 == 0x1b) {
        fVar20 = fVar18;
        fVar18 = fVar17;
        fVar17 = 0.0;
        fVar19 = s[uVar9];
      }
      else {
        fVar19 = 0.0;
        fVar20 = fVar17;
        fVar17 = s[uVar9];
      }
      stbtt__csctx_rccurve_to(c,fVar20,fVar18,s[uVar9 - 2],s[uVar9 - 1],fVar19,fVar17);
      fVar17 = 0.0;
    }
    break;
  case 0x1e:
    iVar15 = 0;
    if ((int)uVar12 < 4) {
      return 0;
    }
    while (iVar15 + 3 < (int)uVar12) {
      iVar14 = iVar15 + 4;
      fVar17 = 0.0;
      if (uVar12 - iVar15 == 5) {
        fVar17 = s[iVar14];
      }
      stbtt__csctx_rccurve_to
                (c,0.0,s[iVar15],s[(long)iVar15 + 1],s[(long)iVar15 + 2],s[iVar15 + 3],fVar17);
LAB_0013d5d9:
      if ((int)uVar12 <= iVar14 + 3) break;
      iVar15 = iVar14 + 4;
      fVar17 = 0.0;
      if (uVar12 - iVar14 == 5) {
        fVar17 = s[iVar15];
      }
      stbtt__csctx_rccurve_to
                (c,s[iVar14],0.0,s[(long)iVar14 + 1],s[(long)iVar14 + 2],fVar17,s[iVar14 + 3]);
    }
    break;
  case 0x1f:
    iVar14 = 0;
    if (3 < (int)uVar12) goto LAB_0013d5d9;
    return 0;
  default:
    if (bVar1 != 0xff) goto switchD_0013cb8a_caseD_2;
LAB_0013cc7d:
    sVar4 = stbtt__buf_get(&local_238,4);
    fVar17 = (float)(int)sVar4 * 1.5258789e-05;
    goto LAB_0013cc96;
  }
  uVar16 = 0;
LAB_0013d07b:
  uVar13 = (ulong)(uint)local_238.cursor;
  uVar9 = (ulong)(uint)local_238.size;
  goto LAB_0013cb4b;
}

Assistant:

static int stbtt__run_charstring(const stbtt_fontinfo *info, int glyph_index, stbtt__csctx *c)
{
   int in_header = 1, maskbits = 0, subr_stack_height = 0, sp = 0, v, i, b0;
   int has_subrs = 0, clear_stack;
   float s[48];
   stbtt__buf subr_stack[10], subrs = info->subrs, b;
   float f;

#define STBTT__CSERR(s) (0)

   // this currently ignores the initial width value, which isn't needed if we have hmtx
   b = stbtt__cff_index_get(info->charstrings, glyph_index);
   while (b.cursor < b.size) {
      i = 0;
      clear_stack = 1;
      b0 = stbtt__buf_get8(&b);
      switch (b0) {
      // @TODO implement hinting
      case 0x13: // hintmask
      case 0x14: // cntrmask
         if (in_header)
            maskbits += (sp / 2); // implicit "vstem"
         in_header = 0;
         stbtt__buf_skip(&b, (maskbits + 7) / 8);
         break;

      case 0x01: // hstem
      case 0x03: // vstem
      case 0x12: // hstemhm
      case 0x17: // vstemhm
         maskbits += (sp / 2);
         break;

      case 0x15: // rmoveto
         in_header = 0;
         if (sp < 2) return STBTT__CSERR("rmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-2], s[sp-1]);
         break;
      case 0x04: // vmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("vmoveto stack");
         stbtt__csctx_rmove_to(c, 0, s[sp-1]);
         break;
      case 0x16: // hmoveto
         in_header = 0;
         if (sp < 1) return STBTT__CSERR("hmoveto stack");
         stbtt__csctx_rmove_to(c, s[sp-1], 0);
         break;

      case 0x05: // rlineto
         if (sp < 2) return STBTT__CSERR("rlineto stack");
         for (; i + 1 < sp; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      // hlineto/vlineto and vhcurveto/hvcurveto alternate horizontal and vertical
      // starting from a different place.

      case 0x07: // vlineto
         if (sp < 1) return STBTT__CSERR("vlineto stack");
         goto vlineto;
      case 0x06: // hlineto
         if (sp < 1) return STBTT__CSERR("hlineto stack");
         for (;;) {
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, s[i], 0);
            i++;
      vlineto:
            if (i >= sp) break;
            stbtt__csctx_rline_to(c, 0, s[i]);
            i++;
         }
         break;

      case 0x1F: // hvcurveto
         if (sp < 4) return STBTT__CSERR("hvcurveto stack");
         goto hvcurveto;
      case 0x1E: // vhcurveto
         if (sp < 4) return STBTT__CSERR("vhcurveto stack");
         for (;;) {
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, 0, s[i], s[i+1], s[i+2], s[i+3], (sp - i == 5) ? s[i + 4] : 0.0f);
            i += 4;
      hvcurveto:
            if (i + 3 >= sp) break;
            stbtt__csctx_rccurve_to(c, s[i], 0, s[i+1], s[i+2], (sp - i == 5) ? s[i+4] : 0.0f, s[i+3]);
            i += 4;
         }
         break;

      case 0x08: // rrcurveto
         if (sp < 6) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x18: // rcurveline
         if (sp < 8) return STBTT__CSERR("rcurveline stack");
         for (; i + 5 < sp - 2; i += 6)
            stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         if (i + 1 >= sp) return STBTT__CSERR("rcurveline stack");
         stbtt__csctx_rline_to(c, s[i], s[i+1]);
         break;

      case 0x19: // rlinecurve
         if (sp < 8) return STBTT__CSERR("rlinecurve stack");
         for (; i + 1 < sp - 6; i += 2)
            stbtt__csctx_rline_to(c, s[i], s[i+1]);
         if (i + 5 >= sp) return STBTT__CSERR("rlinecurve stack");
         stbtt__csctx_rccurve_to(c, s[i], s[i+1], s[i+2], s[i+3], s[i+4], s[i+5]);
         break;

      case 0x1A: // vvcurveto
      case 0x1B: // hhcurveto
         if (sp < 4) return STBTT__CSERR("(vv|hh)curveto stack");
         f = 0.0;
         if (sp & 1) { f = s[i]; i++; }
         for (; i + 3 < sp; i += 4) {
            if (b0 == 0x1B)
               stbtt__csctx_rccurve_to(c, s[i], f, s[i+1], s[i+2], s[i+3], 0.0);
            else
               stbtt__csctx_rccurve_to(c, f, s[i], s[i+1], s[i+2], 0.0, s[i+3]);
            f = 0.0;
         }
         break;

      case 0x0A: // callsubr
         if (!has_subrs) {
            if (info->fdselect.size)
               subrs = stbtt__cid_get_glyph_subrs(info, glyph_index);
            has_subrs = 1;
         }
         // fallthrough
      case 0x1D: // callgsubr
         if (sp < 1) return STBTT__CSERR("call(g|)subr stack");
         v = (int) s[--sp];
         if (subr_stack_height >= 10) return STBTT__CSERR("recursion limit");
         subr_stack[subr_stack_height++] = b;
         b = stbtt__get_subr(b0 == 0x0A ? subrs : info->gsubrs, v);
         if (b.size == 0) return STBTT__CSERR("subr not found");
         b.cursor = 0;
         clear_stack = 0;
         break;

      case 0x0B: // return
         if (subr_stack_height <= 0) return STBTT__CSERR("return outside subr");
         b = subr_stack[--subr_stack_height];
         clear_stack = 0;
         break;

      case 0x0E: // endchar
         stbtt__csctx_close_shape(c);
         return 1;

      case 0x0C: { // two-byte escape
         float dx1, dx2, dx3, dx4, dx5, dx6, dy1, dy2, dy3, dy4, dy5, dy6;
         float dx, dy;
         int b1 = stbtt__buf_get8(&b);
         switch (b1) {
         // @TODO These "flex" implementations ignore the flex-depth and resolution,
         // and always draw beziers.
         case 0x22: // hflex
            if (sp < 7) return STBTT__CSERR("hflex stack");
            dx1 = s[0];
            dx2 = s[1];
            dy2 = s[2];
            dx3 = s[3];
            dx4 = s[4];
            dx5 = s[5];
            dx6 = s[6];
            stbtt__csctx_rccurve_to(c, dx1, 0, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, -dy2, dx6, 0);
            break;

         case 0x23: // flex
            if (sp < 13) return STBTT__CSERR("flex stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = s[10];
            dy6 = s[11];
            //fd is s[12]
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         case 0x24: // hflex1
            if (sp < 9) return STBTT__CSERR("hflex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dx4 = s[5];
            dx5 = s[6];
            dy5 = s[7];
            dx6 = s[8];
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, 0);
            stbtt__csctx_rccurve_to(c, dx4, 0, dx5, dy5, dx6, -(dy1+dy2+dy5));
            break;

         case 0x25: // flex1
            if (sp < 11) return STBTT__CSERR("flex1 stack");
            dx1 = s[0];
            dy1 = s[1];
            dx2 = s[2];
            dy2 = s[3];
            dx3 = s[4];
            dy3 = s[5];
            dx4 = s[6];
            dy4 = s[7];
            dx5 = s[8];
            dy5 = s[9];
            dx6 = dy6 = s[10];
            dx = dx1+dx2+dx3+dx4+dx5;
            dy = dy1+dy2+dy3+dy4+dy5;
            if (STBTT_fabs(dx) > STBTT_fabs(dy))
               dy6 = -dy;
            else
               dx6 = -dx;
            stbtt__csctx_rccurve_to(c, dx1, dy1, dx2, dy2, dx3, dy3);
            stbtt__csctx_rccurve_to(c, dx4, dy4, dx5, dy5, dx6, dy6);
            break;

         default:
            return STBTT__CSERR("unimplemented");
         }
      } break;

      default:
         if (b0 != 255 && b0 != 28 && (b0 < 32 || b0 > 254)) //-V560
            return STBTT__CSERR("reserved operator");

         // push immediate
         if (b0 == 255) {
            f = (float)(stbtt_int32)stbtt__buf_get32(&b) / 0x10000;
         } else {
            stbtt__buf_skip(&b, -1);
            f = (float)(stbtt_int16)stbtt__cff_int(&b);
         }
         if (sp >= 48) return STBTT__CSERR("push stack overflow");
         s[sp++] = f;
         clear_stack = 0;
         break;
      }
      if (clear_stack) sp = 0;
   }
   return STBTT__CSERR("no endchar");

#undef STBTT__CSERR
}